

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O3

void P_SetSlope(secplane_t *plane,bool setCeil,int xyangi,int zangi,DVector3 *pos)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  byte bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  double dVar8;
  undefined1 local_68 [56];
  
  bVar5 = (byte)ib_compatflags;
  if (zangi < 0xb4) {
    if (zangi < 1) {
      dVar1 = 1.0;
    }
    else {
      dVar1 = (double)zangi;
    }
  }
  else {
    dVar1 = 179.0;
  }
  if (setCeil) {
    dVar1 = dVar1 + 180.0;
  }
  dVar1 = FFastTrig::cos(&fasttrig,dVar1 * 11930464.711111112 + 6755399441055744.0);
  dVar2 = (double)xyangi * 11930464.711111112 + 6755399441055744.0;
  if ((bVar5 & 1) == 0) {
    dVar2 = FFastTrig::cos(&fasttrig,dVar2);
    dVar3 = FFastTrig::cos(&fasttrig,dVar2);
    dVar4 = FFastTrig::sin(&fasttrig,dVar3);
    uVar6 = SUB84(dVar4,0);
    uVar7 = (undefined4)((ulong)dVar4 >> 0x20);
    local_68._8_4_ = SUB84(dVar4 * dVar3,0);
    local_68._0_8_ = dVar2 * dVar1;
    local_68._12_4_ = (int)((ulong)(dVar4 * dVar3) >> 0x20);
  }
  else {
    dVar2 = FFastTrig::cos(&fasttrig,dVar2);
    dVar3 = FFastTrig::cos(&fasttrig,dVar2);
    dVar4 = FFastTrig::sin(&fasttrig,dVar3);
    uVar6 = (undefined4)DAT_005f6f50;
    uVar7 = DAT_005f6f50._4_4_;
    local_68._8_8_ =
         (double)(int)(((ulong)(dVar4 + 103079215104.0) & 0xffffffff) *
                      ((ulong)(dVar3 + 103079215104.0) & 0xffffffff)) * DAT_005f6f50._8_8_ *
         DAT_005f6f50._8_8_;
    local_68._0_8_ =
         (double)(int)(((ulong)(dVar2 + 103079215104.0) & 0xffffffff) *
                      ((ulong)(dVar1 + 103079215104.0) & 0xffffffff)) * (double)DAT_005f6f50 *
         (double)DAT_005f6f50;
  }
  dVar4 = FFastTrig::sin(&fasttrig,(double)CONCAT44(uVar7,uVar6));
  dVar1 = c_sqrt(dVar4 * dVar4 +
                 (double)local_68._8_8_ * (double)local_68._8_8_ +
                 (double)local_68._0_8_ * (double)local_68._0_8_);
  dVar8 = (double)(~-(ulong)(dVar1 != 0.0) & (ulong)dVar1 |
                  (ulong)(1.0 / dVar1) & -(ulong)(dVar1 != 0.0));
  dVar4 = dVar8 * dVar4;
  dVar1 = pos->Z;
  dVar2 = pos->X;
  dVar3 = pos->Y;
  (plane->normal).X = dVar8 * (double)local_68._0_8_;
  (plane->normal).Y = dVar8 * (double)local_68._8_8_;
  (plane->normal).Z = dVar4;
  plane->D = (-(dVar8 * (double)local_68._0_8_) * dVar2 - dVar8 * (double)local_68._8_8_ * dVar3) -
             dVar1 * dVar4;
  plane->negiC = -1.0 / dVar4;
  return;
}

Assistant:

void P_SetSlope (secplane_t *plane, bool setCeil, int xyangi, int zangi, const DVector3 &pos)
{
	DAngle xyang;
	DAngle zang;

	if (zangi >= 180)
	{
		zang = 179.;
	}
	else if (zangi <= 0)
	{
		zang = 1.;
	}
	else
	{
		zang = (double)zangi;
	}
	if (setCeil)
	{
		zang += 180.;
	}

	xyang = (double)xyangi;

	DVector3 norm;

	if (ib_compatflags & BCOMPATF_SETSLOPEOVERFLOW)
	{
		// We have to consider an integer multiplication overflow here.
		norm[0] = FixedToFloat(FloatToFixed(zang.Cos()) * FloatToFixed(xyang.Cos())) / 65536.;
		norm[1] = FixedToFloat(FloatToFixed(zang.Cos()) * FloatToFixed(xyang.Sin())) / 65536.;
	}
	else
	{
		norm[0] = zang.Cos() * xyang.Cos();
		norm[1] = zang.Cos() * xyang.Sin();
	}
	norm[2] = zang.Sin();
	norm.MakeUnit();
	double dist = -norm[0] * pos.X - norm[1] * pos.Y - norm[2] * pos.Z;
	plane->set(norm[0], norm[1], norm[2], dist);
}